

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logmq.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  uint uVar2;
  mqd_t __mqdes;
  int iVar3;
  char *pcVar4;
  ssize_t sVar5;
  undefined8 extraout_RAX;
  uint prio;
  string QName;
  uint local_54;
  long *local_50;
  char *local_48;
  long local_40 [2];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"/liblogger","");
  while( true ) {
    uVar2 = getopt(argc,argv,"hq?");
    pcVar1 = local_48;
    pcVar4 = _optarg;
    if (uVar2 != 0x71) break;
    strlen(_optarg);
    std::__cxx11::string::_M_replace((ulong)&local_50,0,pcVar1,(ulong)pcVar4);
  }
  if (uVar2 != 0xffffffff) {
    if (uVar2 == 0x68) {
      print_help(_stdout,*argv);
      exit(0);
    }
    printf("Unknown option \'%c\'\n",(ulong)uVar2);
    print_help(_stderr,*argv);
    exit(1);
  }
  mq_unlink((char *)local_50);
  __mqdes = mq_open((char *)local_50,0xc0,0x1a4,0);
  if (__mqdes < 0) {
    main_cold_2();
  }
  else {
    pcVar4 = (char *)malloc(0xffff);
    while( true ) {
      local_54 = 0;
      sVar5 = mq_receive(__mqdes,pcVar4,0xfffd,&local_54);
      if (sVar5 < 4) break;
      pcVar4[sVar5] = '\0';
      uVar2 = atoi(pcVar4);
      printf("GOT MSG %d %s\n",(ulong)uVar2,pcVar4 + 1);
    }
    perror("mq_receive");
    iVar3 = mq_close(__mqdes);
    if (-1 < iVar3) {
      free(pcVar4);
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      return 0;
    }
  }
  main_cold_1();
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char **argv) {
    std::string QName = "/liblogger";
    const char *ops = "hq?";
    int opt = 0;

    while( (opt = getopt(argc, argv, ops)) != -1) {
        switch(opt) {
            case 'h':
                print_help(stdout, argv[0]);
                exit(EXIT_SUCCESS);
                break;
            case 'q':
                QName = optarg;
                break;
            default:
                printf("Unknown option '%c'\n", opt);
                print_help(stderr, argv[0]);
                exit(EXIT_FAILURE);
                break;
        }
    }
    
    mq_unlink(QName.c_str());

    mqd_t qid = mq_open(QName.c_str(), O_RDONLY | O_CREAT | O_EXCL, 0644, NULL);
    if (qid < 0) {
        perror("mq_open");
        exit(EXIT_FAILURE);
    }

    size_t buflen = 65535;
    char *buf = (char *) malloc(buflen);

    bool running = true;
    do {
        unsigned int prio = 0;
        ssize_t ret = mq_receive(qid, buf, buflen - 2, &prio);
        if (ret > 3) {
            buf[ret] = 0;
            const int type = atoi(buf);
            const char *msg = &buf[1];
            printf("GOT MSG %d %s\n", type, msg);

        } else {
            perror("mq_receive");
            running = false;
        }

    } while(running);

    if (mq_close(qid) < 0) {
        perror("mq_close");
        abort();
    }

    free(buf);

    return EXIT_SUCCESS;
}